

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# interp_bilinear_pack16.h
# Opt level: O0

void ncnn::resize_bilinear_image_pack16
               (Mat *src,Mat *dst,float *alpha,int *xofs,float *beta,int *yofs)

{
  int iVar1;
  int iVar2;
  long lVar3;
  long lVar4;
  long lVar5;
  long lVar6;
  undefined1 (*pauVar7) [64];
  int iVar8;
  long in_RCX;
  uint *in_RDX;
  long *in_RSI;
  long *in_RDI;
  uint *in_R8;
  long in_R9;
  undefined1 auVar9 [64];
  undefined1 auVar10 [64];
  __m512 _D;
  __m512 _rows1_2;
  __m512 _rows0_1;
  int dx_2;
  float *Dp;
  float *rows1p;
  float *rows0p;
  __m512 _b1;
  __m512 _b0;
  __m512 _rows1_1;
  __m512 _rows0;
  __m512 _S11_1;
  __m512 _S10_1;
  __m512 _S01;
  __m512 _S00;
  __m512 _a1_1;
  __m512 _a0_1;
  float *S1p_1;
  float *S0p;
  int sx_1;
  int dx_1;
  float *rows1p_2;
  float *rows0p_1;
  float *alphap_1;
  float *S1_1;
  float *S0;
  __m512 _rows1;
  __m512 _S11;
  __m512 _S10;
  __m512 _a1;
  __m512 _a0;
  float *S1p;
  int sx;
  int dx;
  float *rows1p_1;
  float *alphap;
  float *S1;
  float *rows0_old;
  int sy;
  int dy;
  int prev_sy1;
  float *rows1;
  float *rows0;
  Mat rowsbuf1;
  Mat rowsbuf0;
  int h;
  int w;
  Allocator *in_stack_ffffffffffffed98;
  Mat *pMVar11;
  undefined8 in_stack_ffffffffffffeda0;
  int iVar12;
  size_t in_stack_ffffffffffffeda8;
  undefined1 (**ppauVar13) [64];
  Mat *in_stack_ffffffffffffedb8;
  undefined8 local_1240;
  undefined8 uStack_1238;
  undefined8 uStack_1230;
  undefined8 uStack_1228;
  undefined8 uStack_1220;
  undefined8 uStack_1218;
  undefined8 uStack_1210;
  undefined8 uStack_1208;
  int local_115c;
  undefined8 *local_1158;
  undefined1 (*local_1150) [64];
  undefined1 (*local_1148) [64];
  undefined8 local_10c0;
  undefined8 uStack_10b8;
  undefined8 uStack_10b0;
  undefined8 uStack_10a8;
  undefined8 uStack_10a0;
  undefined8 uStack_1098;
  undefined8 uStack_1090;
  undefined8 uStack_1088;
  undefined8 local_1080;
  undefined8 uStack_1078;
  undefined8 uStack_1070;
  undefined8 uStack_1068;
  undefined8 uStack_1060;
  undefined8 uStack_1058;
  undefined8 uStack_1050;
  undefined8 uStack_1048;
  int local_eac;
  uint *local_e98;
  undefined8 local_e80;
  undefined8 uStack_e78;
  undefined8 uStack_e70;
  undefined8 uStack_e68;
  undefined8 uStack_e60;
  undefined8 uStack_e58;
  undefined8 uStack_e50;
  undefined8 uStack_e48;
  int local_cfc;
  uint *local_cf0;
  int local_cd0;
  int local_ccc;
  undefined1 (*local_cc8) [64];
  undefined1 (*local_cc0) [64];
  Mat local_ca8;
  undefined1 (*local_c60) [64];
  int *local_c58;
  undefined8 local_c50;
  undefined4 local_c48;
  long *local_c40;
  undefined4 local_c38;
  undefined4 local_c34;
  undefined4 local_c30;
  undefined4 local_c2c;
  undefined4 local_c28;
  undefined8 local_c20;
  int local_c18;
  int local_c14;
  long local_c10;
  uint *local_c08;
  long local_c00;
  uint *local_bf8;
  long *local_bf0;
  long *local_be8;
  Mat *local_be0;
  undefined1 (**local_bd0) [64];
  int local_bbc;
  long *local_bb8;
  int local_bac;
  long *local_ba8;
  int local_b9c;
  long *local_b98;
  int local_b8c;
  long *local_b88;
  undefined1 (*local_b80) [64];
  undefined1 (*local_b78) [64];
  undefined1 (*local_b70) [64];
  undefined1 (*local_b68) [64];
  undefined1 (*local_b60) [64];
  undefined1 (*local_b58) [64];
  undefined1 (*local_b50) [64];
  undefined1 (*local_b48) [64];
  undefined8 local_b40;
  undefined8 uStack_b38;
  undefined8 uStack_b30;
  undefined8 uStack_b28;
  undefined8 uStack_b20;
  undefined8 uStack_b18;
  undefined8 uStack_b10;
  undefined8 uStack_b08;
  undefined8 *local_ac8;
  undefined8 local_ac0;
  undefined8 uStack_ab8;
  undefined8 uStack_ab0;
  undefined8 uStack_aa8;
  undefined8 uStack_aa0;
  undefined8 uStack_a98;
  undefined8 uStack_a90;
  undefined8 uStack_a88;
  undefined8 *local_a48;
  undefined8 local_a40;
  undefined8 uStack_a38;
  undefined8 uStack_a30;
  undefined8 uStack_a28;
  undefined8 uStack_a20;
  undefined8 uStack_a18;
  undefined8 uStack_a10;
  undefined8 uStack_a08;
  undefined8 *local_9c8;
  undefined8 local_9c0;
  undefined8 uStack_9b8;
  undefined8 uStack_9b0;
  undefined8 uStack_9a8;
  undefined8 uStack_9a0;
  undefined8 uStack_998;
  undefined8 uStack_990;
  undefined8 uStack_988;
  undefined8 *local_948;
  undefined1 local_940 [64];
  uint local_8c4;
  undefined1 local_8c0 [64];
  uint local_844;
  undefined1 local_840 [64];
  uint local_7c4;
  undefined1 local_7c0 [64];
  uint local_744;
  undefined1 local_740 [64];
  uint local_6c4;
  undefined1 local_6c0 [64];
  uint local_644;
  undefined8 local_640;
  undefined8 uStack_638;
  undefined8 uStack_630;
  undefined8 uStack_628;
  undefined8 uStack_620;
  undefined8 uStack_618;
  undefined8 uStack_610;
  undefined8 uStack_608;
  undefined8 local_600;
  undefined8 uStack_5f8;
  undefined8 uStack_5f0;
  undefined8 uStack_5e8;
  undefined8 uStack_5e0;
  undefined8 uStack_5d8;
  undefined8 uStack_5d0;
  undefined8 uStack_5c8;
  undefined8 local_5c0;
  undefined8 uStack_5b8;
  undefined8 uStack_5b0;
  undefined8 uStack_5a8;
  undefined8 uStack_5a0;
  undefined8 uStack_598;
  undefined8 uStack_590;
  undefined8 uStack_588;
  undefined8 local_580;
  undefined8 uStack_578;
  undefined8 uStack_570;
  undefined8 uStack_568;
  undefined8 uStack_560;
  undefined8 uStack_558;
  undefined8 uStack_550;
  undefined8 uStack_548;
  undefined8 local_540;
  undefined8 uStack_538;
  undefined8 uStack_530;
  undefined8 uStack_528;
  undefined8 uStack_520;
  undefined8 uStack_518;
  undefined8 uStack_510;
  undefined8 uStack_508;
  undefined8 local_500;
  undefined8 uStack_4f8;
  undefined8 uStack_4f0;
  undefined8 uStack_4e8;
  undefined8 uStack_4e0;
  undefined8 uStack_4d8;
  undefined8 uStack_4d0;
  undefined8 uStack_4c8;
  undefined8 local_4c0;
  undefined8 uStack_4b8;
  undefined8 uStack_4b0;
  undefined8 uStack_4a8;
  undefined8 uStack_4a0;
  undefined8 uStack_498;
  undefined8 uStack_490;
  undefined8 uStack_488;
  undefined8 local_480;
  undefined8 uStack_478;
  undefined8 uStack_470;
  undefined8 uStack_468;
  undefined8 uStack_460;
  undefined8 uStack_458;
  undefined8 uStack_450;
  undefined8 uStack_448;
  undefined8 local_440;
  undefined8 uStack_438;
  undefined8 uStack_430;
  undefined8 uStack_428;
  undefined8 uStack_420;
  undefined8 uStack_418;
  undefined8 uStack_410;
  undefined8 uStack_408;
  undefined8 local_400;
  undefined8 uStack_3f8;
  undefined8 uStack_3f0;
  undefined8 uStack_3e8;
  undefined8 uStack_3e0;
  undefined8 uStack_3d8;
  undefined8 uStack_3d0;
  undefined8 uStack_3c8;
  undefined8 local_3c0;
  undefined8 uStack_3b8;
  undefined8 uStack_3b0;
  undefined8 uStack_3a8;
  undefined8 uStack_3a0;
  undefined8 uStack_398;
  undefined8 uStack_390;
  undefined8 uStack_388;
  undefined8 local_380;
  undefined8 uStack_378;
  undefined8 uStack_370;
  undefined8 uStack_368;
  undefined8 uStack_360;
  undefined8 uStack_358;
  undefined8 uStack_350;
  undefined8 uStack_348;
  undefined8 local_340;
  undefined8 uStack_338;
  undefined8 uStack_330;
  undefined8 uStack_328;
  undefined8 uStack_320;
  undefined8 uStack_318;
  undefined8 uStack_310;
  undefined8 uStack_308;
  undefined8 local_300;
  undefined8 uStack_2f8;
  undefined8 uStack_2f0;
  undefined8 uStack_2e8;
  undefined8 uStack_2e0;
  undefined8 uStack_2d8;
  undefined8 uStack_2d0;
  undefined8 uStack_2c8;
  undefined8 local_2c0;
  undefined8 uStack_2b8;
  undefined8 uStack_2b0;
  undefined8 uStack_2a8;
  undefined8 uStack_2a0;
  undefined8 uStack_298;
  undefined8 uStack_290;
  undefined8 uStack_288;
  undefined8 local_280;
  undefined8 uStack_278;
  undefined8 uStack_270;
  undefined8 uStack_268;
  undefined8 uStack_260;
  undefined8 uStack_258;
  undefined8 uStack_250;
  undefined8 uStack_248;
  undefined8 local_240;
  undefined8 uStack_238;
  undefined8 uStack_230;
  undefined8 uStack_228;
  undefined8 uStack_220;
  undefined8 uStack_218;
  undefined8 uStack_210;
  undefined8 uStack_208;
  undefined8 local_200;
  undefined8 uStack_1f8;
  undefined8 uStack_1f0;
  undefined8 uStack_1e8;
  undefined8 uStack_1e0;
  undefined8 uStack_1d8;
  undefined8 uStack_1d0;
  undefined8 uStack_1c8;
  undefined8 local_1c0;
  undefined8 uStack_1b8;
  undefined8 uStack_1b0;
  undefined8 uStack_1a8;
  undefined8 uStack_1a0;
  undefined8 uStack_198;
  undefined8 uStack_190;
  undefined8 uStack_188;
  undefined8 local_180;
  undefined8 uStack_178;
  undefined8 uStack_170;
  undefined8 uStack_168;
  undefined8 uStack_160;
  undefined8 uStack_158;
  undefined8 uStack_150;
  undefined8 uStack_148;
  int local_100;
  undefined4 local_fc;
  undefined1 (**local_f8) [64];
  int local_e0;
  undefined4 local_dc;
  Mat *local_d8;
  undefined1 (*local_d0) [64];
  undefined1 (*local_c0) [64];
  undefined8 local_b0;
  undefined4 local_a4;
  undefined8 local_a0;
  int local_94;
  undefined1 (**local_90) [64];
  undefined8 local_88;
  undefined4 local_7c;
  undefined8 local_78;
  int local_6c;
  Mat *local_68;
  Mat *local_60;
  undefined1 (**local_58) [64];
  
  iVar12 = (int)((ulong)in_stack_ffffffffffffeda0 >> 0x20);
  local_c14 = *(int *)((long)in_RSI + 0x2c);
  local_c18 = (int)in_RSI[6];
  ppauVar13 = &local_c60;
  local_a0 = 0x40;
  local_a4 = 0x10;
  local_b0 = 0;
  local_c60 = (undefined1 (*) [64])0x0;
  local_c58 = (int *)0x0;
  local_c50 = 0;
  local_c48 = 0;
  local_c40 = (long *)0x0;
  local_c38 = 0;
  local_c34 = 0;
  local_c30 = 0;
  local_c2c = 0;
  local_c28 = 0;
  local_c20 = 0;
  local_c10 = in_R9;
  local_c08 = in_R8;
  local_c00 = in_RCX;
  local_bf8 = in_RDX;
  local_bf0 = in_RSI;
  local_be8 = in_RDI;
  local_94 = local_c14;
  local_90 = ppauVar13;
  Mat::create(in_stack_ffffffffffffedb8,(int)((ulong)ppauVar13 >> 0x20),in_stack_ffffffffffffeda8,
              iVar12,in_stack_ffffffffffffed98);
  local_68 = &local_ca8;
  local_6c = local_c14;
  local_78 = 0x40;
  local_7c = 0x10;
  local_88 = 0;
  local_ca8.data = (undefined1 (*) [64])0x0;
  local_ca8.refcount = (int *)0x0;
  local_ca8.elemsize = 0;
  local_ca8.elempack = 0;
  local_ca8.allocator = (Allocator *)0x0;
  local_ca8.dims = 0;
  local_ca8.w = 0;
  local_ca8.h = 0;
  local_ca8.d = 0;
  local_ca8.c = 0;
  local_ca8.cstep = 0;
  Mat::create(local_68,(int)((ulong)ppauVar13 >> 0x20),in_stack_ffffffffffffeda8,iVar12,
              in_stack_ffffffffffffed98);
  local_58 = &local_c60;
  local_cc0 = local_c60;
  local_60 = &local_ca8;
  local_cc8 = (undefined1 (*) [64])local_ca8.data;
  local_ccc = -2;
  for (local_cd0 = 0; pauVar7 = local_cc0, local_cd0 < local_c18; local_cd0 = local_cd0 + 1) {
    iVar12 = *(int *)(local_c10 + (long)local_cd0 * 4);
    if (iVar12 != local_ccc) {
      if (iVar12 == local_ccc + 1) {
        local_cc0 = local_cc8;
        local_cc8 = pauVar7;
        local_b9c = iVar12 + 1;
        local_b98 = local_be8;
        lVar3 = *local_be8;
        iVar1 = *(int *)((long)local_be8 + 0x2c);
        lVar4 = local_be8[2];
        local_cf0 = local_bf8;
        for (local_cfc = 0; local_cfc < local_c14; local_cfc = local_cfc + 1) {
          local_b48 = (undefined1 (*) [64])
                      (lVar3 + (long)iVar1 * (long)local_b9c * lVar4 +
                      (long)(*(int *)(local_c00 + (long)local_cfc * 4) << 4) * 4);
          local_644 = *local_cf0;
          local_6c0 = vbroadcastss_avx512f(ZEXT416(local_644));
          local_6c4 = local_cf0[1];
          local_740 = vbroadcastss_avx512f(ZEXT416(local_6c4));
          local_480 = *(undefined8 *)*local_b48;
          uStack_478 = *(undefined8 *)(*local_b48 + 8);
          uStack_470 = *(undefined8 *)(*local_b48 + 0x10);
          uStack_468 = *(undefined8 *)(*local_b48 + 0x18);
          uStack_460 = *(undefined8 *)(*local_b48 + 0x20);
          uStack_458 = *(undefined8 *)(*local_b48 + 0x28);
          uStack_450 = *(undefined8 *)(*local_b48 + 0x30);
          uStack_448 = *(undefined8 *)(*local_b48 + 0x38);
          local_b50 = local_b48 + 1;
          local_180 = *(undefined8 *)*local_b50;
          uStack_178 = *(undefined8 *)(local_b48[1] + 8);
          uStack_170 = *(undefined8 *)(local_b48[1] + 0x10);
          uStack_168 = *(undefined8 *)(local_b48[1] + 0x18);
          uStack_160 = *(undefined8 *)(local_b48[1] + 0x20);
          uStack_158 = *(undefined8 *)(local_b48[1] + 0x28);
          uStack_150 = *(undefined8 *)(local_b48[1] + 0x30);
          uStack_148 = *(undefined8 *)(local_b48[1] + 0x38);
          local_4c0 = local_6c0._0_8_;
          uStack_4b8 = local_6c0._8_8_;
          uStack_4b0 = local_6c0._16_8_;
          uStack_4a8 = local_6c0._24_8_;
          uStack_4a0 = local_6c0._32_8_;
          uStack_498 = local_6c0._40_8_;
          uStack_490 = local_6c0._48_8_;
          uStack_488 = local_6c0._56_8_;
          auVar10 = vmulps_avx512f(*local_b48,local_6c0);
          local_1c0 = local_740._0_8_;
          uStack_1b8 = local_740._8_8_;
          uStack_1b0 = local_740._16_8_;
          uStack_1a8 = local_740._24_8_;
          uStack_1a0 = local_740._32_8_;
          uStack_198 = local_740._40_8_;
          uStack_190 = local_740._48_8_;
          uStack_188 = local_740._56_8_;
          local_e80 = auVar10._0_8_;
          local_200 = local_e80;
          uStack_e78 = auVar10._8_8_;
          uStack_1f8 = uStack_e78;
          uStack_e70 = auVar10._16_8_;
          uStack_1f0 = uStack_e70;
          uStack_e68 = auVar10._24_8_;
          uStack_1e8 = uStack_e68;
          uStack_e60 = auVar10._32_8_;
          uStack_1e0 = uStack_e60;
          uStack_e58 = auVar10._40_8_;
          uStack_1d8 = uStack_e58;
          uStack_e50 = auVar10._48_8_;
          uStack_1d0 = uStack_e50;
          uStack_e48 = auVar10._56_8_;
          uStack_1c8 = uStack_e48;
          auVar10 = vfmadd213ps_avx512f(local_740,*local_b50,auVar10);
          local_948 = (undefined8 *)(*pauVar7 + (long)(local_cfc << 4) * 4);
          local_e80 = auVar10._0_8_;
          local_9c0 = local_e80;
          uStack_e78 = auVar10._8_8_;
          uStack_9b8 = uStack_e78;
          uStack_e70 = auVar10._16_8_;
          uStack_9b0 = uStack_e70;
          uStack_e68 = auVar10._24_8_;
          uStack_9a8 = uStack_e68;
          uStack_e60 = auVar10._32_8_;
          uStack_9a0 = uStack_e60;
          uStack_e58 = auVar10._40_8_;
          uStack_998 = uStack_e58;
          uStack_e50 = auVar10._48_8_;
          uStack_990 = uStack_e50;
          uStack_e48 = auVar10._56_8_;
          uStack_988 = uStack_e48;
          *local_948 = local_e80;
          local_948[1] = uStack_e78;
          local_948[2] = uStack_e70;
          local_948[3] = uStack_e68;
          local_948[4] = uStack_e60;
          local_948[5] = uStack_e58;
          local_948[6] = uStack_e50;
          local_948[7] = uStack_e48;
          local_cf0 = local_cf0 + 2;
        }
      }
      else {
        local_ba8 = local_be8;
        lVar3 = *local_be8;
        iVar1 = *(int *)((long)local_be8 + 0x2c);
        lVar4 = local_be8[2];
        local_bbc = iVar12 + 1;
        local_bb8 = local_be8;
        lVar5 = *local_be8;
        iVar2 = *(int *)((long)local_be8 + 0x2c);
        lVar6 = local_be8[2];
        local_e98 = local_bf8;
        for (local_eac = 0; local_bac = iVar12, local_eac < local_c14; local_eac = local_eac + 1) {
          iVar8 = *(int *)(local_c00 + (long)local_eac * 4) << 4;
          local_b58 = (undefined1 (*) [64])
                      (lVar3 + (long)iVar1 * (long)iVar12 * lVar4 + (long)iVar8 * 4);
          local_b68 = (undefined1 (*) [64])
                      (lVar5 + (long)iVar2 * (long)local_bbc * lVar6 + (long)iVar8 * 4);
          local_744 = *local_e98;
          local_7c0 = vbroadcastss_avx512f(ZEXT416(local_744));
          local_7c4 = local_e98[1];
          local_840 = vbroadcastss_avx512f(ZEXT416(local_7c4));
          local_500 = *(undefined8 *)*local_b58;
          uStack_4f8 = *(undefined8 *)(*local_b58 + 8);
          uStack_4f0 = *(undefined8 *)(*local_b58 + 0x10);
          uStack_4e8 = *(undefined8 *)(*local_b58 + 0x18);
          uStack_4e0 = *(undefined8 *)(*local_b58 + 0x20);
          uStack_4d8 = *(undefined8 *)(*local_b58 + 0x28);
          uStack_4d0 = *(undefined8 *)(*local_b58 + 0x30);
          uStack_4c8 = *(undefined8 *)(*local_b58 + 0x38);
          local_b60 = local_b58 + 1;
          local_240 = *(undefined8 *)*local_b60;
          uStack_238 = *(undefined8 *)(local_b58[1] + 8);
          uStack_230 = *(undefined8 *)(local_b58[1] + 0x10);
          uStack_228 = *(undefined8 *)(local_b58[1] + 0x18);
          uStack_220 = *(undefined8 *)(local_b58[1] + 0x20);
          uStack_218 = *(undefined8 *)(local_b58[1] + 0x28);
          uStack_210 = *(undefined8 *)(local_b58[1] + 0x30);
          uStack_208 = *(undefined8 *)(local_b58[1] + 0x38);
          local_580 = *(undefined8 *)*local_b68;
          uStack_578 = *(undefined8 *)(*local_b68 + 8);
          uStack_570 = *(undefined8 *)(*local_b68 + 0x10);
          uStack_568 = *(undefined8 *)(*local_b68 + 0x18);
          uStack_560 = *(undefined8 *)(*local_b68 + 0x20);
          uStack_558 = *(undefined8 *)(*local_b68 + 0x28);
          uStack_550 = *(undefined8 *)(*local_b68 + 0x30);
          uStack_548 = *(undefined8 *)(*local_b68 + 0x38);
          local_b70 = local_b68 + 1;
          local_300 = *(undefined8 *)*local_b70;
          uStack_2f8 = *(undefined8 *)(local_b68[1] + 8);
          uStack_2f0 = *(undefined8 *)(local_b68[1] + 0x10);
          uStack_2e8 = *(undefined8 *)(local_b68[1] + 0x18);
          uStack_2e0 = *(undefined8 *)(local_b68[1] + 0x20);
          uStack_2d8 = *(undefined8 *)(local_b68[1] + 0x28);
          uStack_2d0 = *(undefined8 *)(local_b68[1] + 0x30);
          uStack_2c8 = *(undefined8 *)(local_b68[1] + 0x38);
          local_540 = local_7c0._0_8_;
          uStack_538 = local_7c0._8_8_;
          uStack_530 = local_7c0._16_8_;
          uStack_528 = local_7c0._24_8_;
          uStack_520 = local_7c0._32_8_;
          uStack_518 = local_7c0._40_8_;
          uStack_510 = local_7c0._48_8_;
          uStack_508 = local_7c0._56_8_;
          auVar10 = vmulps_avx512f(*local_b58,local_7c0);
          local_5c0 = local_7c0._0_8_;
          uStack_5b8 = local_7c0._8_8_;
          uStack_5b0 = local_7c0._16_8_;
          uStack_5a8 = local_7c0._24_8_;
          uStack_5a0 = local_7c0._32_8_;
          uStack_598 = local_7c0._40_8_;
          uStack_590 = local_7c0._48_8_;
          uStack_588 = local_7c0._56_8_;
          auVar9 = vmulps_avx512f(*local_b68,local_7c0);
          local_280 = local_840._0_8_;
          uStack_278 = local_840._8_8_;
          uStack_270 = local_840._16_8_;
          uStack_268 = local_840._24_8_;
          uStack_260 = local_840._32_8_;
          uStack_258 = local_840._40_8_;
          uStack_250 = local_840._48_8_;
          uStack_248 = local_840._56_8_;
          local_1080 = auVar10._0_8_;
          local_2c0 = local_1080;
          uStack_1078 = auVar10._8_8_;
          uStack_2b8 = uStack_1078;
          uStack_1070 = auVar10._16_8_;
          uStack_2b0 = uStack_1070;
          uStack_1068 = auVar10._24_8_;
          uStack_2a8 = uStack_1068;
          uStack_1060 = auVar10._32_8_;
          uStack_2a0 = uStack_1060;
          uStack_1058 = auVar10._40_8_;
          uStack_298 = uStack_1058;
          uStack_1050 = auVar10._48_8_;
          uStack_290 = uStack_1050;
          uStack_1048 = auVar10._56_8_;
          uStack_288 = uStack_1048;
          auVar10 = vfmadd213ps_avx512f(local_840,*local_b60,auVar10);
          local_340 = local_840._0_8_;
          uStack_338 = local_840._8_8_;
          uStack_330 = local_840._16_8_;
          uStack_328 = local_840._24_8_;
          uStack_320 = local_840._32_8_;
          uStack_318 = local_840._40_8_;
          uStack_310 = local_840._48_8_;
          uStack_308 = local_840._56_8_;
          local_10c0 = auVar9._0_8_;
          local_380 = local_10c0;
          uStack_10b8 = auVar9._8_8_;
          uStack_378 = uStack_10b8;
          uStack_10b0 = auVar9._16_8_;
          uStack_370 = uStack_10b0;
          uStack_10a8 = auVar9._24_8_;
          uStack_368 = uStack_10a8;
          uStack_10a0 = auVar9._32_8_;
          uStack_360 = uStack_10a0;
          uStack_1098 = auVar9._40_8_;
          uStack_358 = uStack_1098;
          uStack_1090 = auVar9._48_8_;
          uStack_350 = uStack_1090;
          uStack_1088 = auVar9._56_8_;
          uStack_348 = uStack_1088;
          auVar9 = vfmadd213ps_avx512f(local_840,*local_b70,auVar9);
          local_9c8 = (undefined8 *)(*local_cc0 + (long)(local_eac << 4) * 4);
          local_1080 = auVar10._0_8_;
          local_a40 = local_1080;
          uStack_1078 = auVar10._8_8_;
          uStack_a38 = uStack_1078;
          uStack_1070 = auVar10._16_8_;
          uStack_a30 = uStack_1070;
          uStack_1068 = auVar10._24_8_;
          uStack_a28 = uStack_1068;
          uStack_1060 = auVar10._32_8_;
          uStack_a20 = uStack_1060;
          uStack_1058 = auVar10._40_8_;
          uStack_a18 = uStack_1058;
          uStack_1050 = auVar10._48_8_;
          uStack_a10 = uStack_1050;
          uStack_1048 = auVar10._56_8_;
          uStack_a08 = uStack_1048;
          *local_9c8 = local_1080;
          local_9c8[1] = uStack_1078;
          local_9c8[2] = uStack_1070;
          local_9c8[3] = uStack_1068;
          local_9c8[4] = uStack_1060;
          local_9c8[5] = uStack_1058;
          local_9c8[6] = uStack_1050;
          local_9c8[7] = uStack_1048;
          local_a48 = (undefined8 *)(*local_cc8 + (long)(local_eac << 4) * 4);
          local_10c0 = auVar9._0_8_;
          local_ac0 = local_10c0;
          uStack_10b8 = auVar9._8_8_;
          uStack_ab8 = uStack_10b8;
          uStack_10b0 = auVar9._16_8_;
          uStack_ab0 = uStack_10b0;
          uStack_10a8 = auVar9._24_8_;
          uStack_aa8 = uStack_10a8;
          uStack_10a0 = auVar9._32_8_;
          uStack_aa0 = uStack_10a0;
          uStack_1098 = auVar9._40_8_;
          uStack_a98 = uStack_1098;
          uStack_1090 = auVar9._48_8_;
          uStack_a90 = uStack_1090;
          uStack_1088 = auVar9._56_8_;
          uStack_a88 = uStack_1088;
          *local_a48 = local_10c0;
          local_a48[1] = uStack_10b8;
          local_a48[2] = uStack_10b0;
          local_a48[3] = uStack_10a8;
          local_a48[4] = uStack_10a0;
          local_a48[5] = uStack_1098;
          local_a48[6] = uStack_1090;
          local_a48[7] = uStack_1088;
          local_e98 = local_e98 + 2;
        }
      }
    }
    local_844 = *local_c08;
    local_8c0 = vbroadcastss_avx512f(ZEXT416(local_844));
    local_8c4 = local_c08[1];
    local_940 = vbroadcastss_avx512f(ZEXT416(local_8c4));
    local_1148 = local_cc0;
    local_1150 = local_cc8;
    local_b88 = local_bf0;
    local_b8c = local_cd0;
    local_1158 = (undefined8 *)
                 (*local_bf0 +
                 (long)*(int *)((long)local_bf0 + 0x2c) * (long)local_cd0 * local_bf0[2]);
    for (local_115c = 0; local_115c < local_c14; local_115c = local_115c + 1) {
      local_b78 = local_1148;
      local_600 = *(undefined8 *)*local_1148;
      uStack_5f8 = *(undefined8 *)(*local_1148 + 8);
      uStack_5f0 = *(undefined8 *)(*local_1148 + 0x10);
      uStack_5e8 = *(undefined8 *)(*local_1148 + 0x18);
      uStack_5e0 = *(undefined8 *)(*local_1148 + 0x20);
      uStack_5d8 = *(undefined8 *)(*local_1148 + 0x28);
      uStack_5d0 = *(undefined8 *)(*local_1148 + 0x30);
      uStack_5c8 = *(undefined8 *)(*local_1148 + 0x38);
      local_b80 = local_1150;
      local_3c0 = *(undefined8 *)*local_1150;
      uStack_3b8 = *(undefined8 *)(*local_1150 + 8);
      uStack_3b0 = *(undefined8 *)(*local_1150 + 0x10);
      uStack_3a8 = *(undefined8 *)(*local_1150 + 0x18);
      uStack_3a0 = *(undefined8 *)(*local_1150 + 0x20);
      uStack_398 = *(undefined8 *)(*local_1150 + 0x28);
      uStack_390 = *(undefined8 *)(*local_1150 + 0x30);
      uStack_388 = *(undefined8 *)(*local_1150 + 0x38);
      local_640 = local_8c0._0_8_;
      uStack_638 = local_8c0._8_8_;
      uStack_630 = local_8c0._16_8_;
      uStack_628 = local_8c0._24_8_;
      uStack_620 = local_8c0._32_8_;
      uStack_618 = local_8c0._40_8_;
      uStack_610 = local_8c0._48_8_;
      uStack_608 = local_8c0._56_8_;
      auVar10 = vmulps_avx512f(*local_1148,local_8c0);
      local_400 = local_940._0_8_;
      uStack_3f8 = local_940._8_8_;
      uStack_3f0 = local_940._16_8_;
      uStack_3e8 = local_940._24_8_;
      uStack_3e0 = local_940._32_8_;
      uStack_3d8 = local_940._40_8_;
      uStack_3d0 = local_940._48_8_;
      uStack_3c8 = local_940._56_8_;
      local_1240 = auVar10._0_8_;
      local_440 = local_1240;
      uStack_1238 = auVar10._8_8_;
      uStack_438 = uStack_1238;
      uStack_1230 = auVar10._16_8_;
      uStack_430 = uStack_1230;
      uStack_1228 = auVar10._24_8_;
      uStack_428 = uStack_1228;
      uStack_1220 = auVar10._32_8_;
      uStack_420 = uStack_1220;
      uStack_1218 = auVar10._40_8_;
      uStack_418 = uStack_1218;
      uStack_1210 = auVar10._48_8_;
      uStack_410 = uStack_1210;
      uStack_1208 = auVar10._56_8_;
      uStack_408 = uStack_1208;
      auVar10 = vfmadd213ps_avx512f(local_940,*local_1150,auVar10);
      local_ac8 = local_1158;
      local_1240 = auVar10._0_8_;
      local_b40 = local_1240;
      uStack_1238 = auVar10._8_8_;
      uStack_b38 = uStack_1238;
      uStack_1230 = auVar10._16_8_;
      uStack_b30 = uStack_1230;
      uStack_1228 = auVar10._24_8_;
      uStack_b28 = uStack_1228;
      uStack_1220 = auVar10._32_8_;
      uStack_b20 = uStack_1220;
      uStack_1218 = auVar10._40_8_;
      uStack_b18 = uStack_1218;
      uStack_1210 = auVar10._48_8_;
      uStack_b10 = uStack_1210;
      uStack_1208 = auVar10._56_8_;
      uStack_b08 = uStack_1208;
      *local_1158 = local_1240;
      local_1158[1] = uStack_1238;
      local_1158[2] = uStack_1230;
      local_1158[3] = uStack_1228;
      local_1158[4] = uStack_1220;
      local_1158[5] = uStack_1218;
      local_1158[6] = uStack_1210;
      local_1158[7] = uStack_1208;
      local_1158 = local_1158 + 8;
      local_1148 = local_1148 + 1;
      local_1150 = local_1150 + 1;
    }
    local_c08 = local_c08 + 2;
    local_ccc = iVar12;
  }
  pMVar11 = &local_ca8;
  local_be0 = pMVar11;
  local_d8 = pMVar11;
  if (local_ca8.refcount != (int *)0x0) {
    local_dc = 0xffffffff;
    LOCK();
    local_e0 = *local_ca8.refcount;
    *local_ca8.refcount = *local_ca8.refcount + -1;
    UNLOCK();
    if (local_e0 == 1) {
      if (local_ca8.allocator == (Allocator *)0x0) {
        local_d0 = (undefined1 (*) [64])local_ca8.data;
        if ((undefined1 (*) [64])local_ca8.data != (undefined1 (*) [64])0x0) {
          free(local_ca8.data);
        }
      }
      else {
        (*(local_ca8.allocator)->_vptr_Allocator[3])(local_ca8.allocator,local_ca8.data);
      }
    }
  }
  pMVar11->data = (void *)0x0;
  pMVar11->elemsize = 0;
  pMVar11->elempack = 0;
  pMVar11->dims = 0;
  pMVar11->w = 0;
  pMVar11->h = 0;
  pMVar11->d = 0;
  pMVar11->c = 0;
  pMVar11->cstep = 0;
  pMVar11->refcount = (int *)0x0;
  local_bd0 = &local_c60;
  if (local_c58 != (int *)0x0) {
    local_fc = 0xffffffff;
    LOCK();
    local_100 = *local_c58;
    *local_c58 = *local_c58 + -1;
    UNLOCK();
    if (local_100 == 1) {
      local_f8 = local_bd0;
      if (local_c40 == (long *)0x0) {
        local_c0 = local_c60;
        if (local_c60 != (undefined1 (*) [64])0x0) {
          free(local_c60);
        }
      }
      else {
        (**(code **)(*local_c40 + 0x18))(local_c40,local_c60);
      }
    }
  }
  return;
}

Assistant:

static void resize_bilinear_image_pack16(const Mat& src, Mat& dst, float* alpha, int* xofs, float* beta, int* yofs)
{
    int w = dst.w;
    int h = dst.h;

    // loop body
    Mat rowsbuf0(w, (size_t)16 * 4u, 16);
    Mat rowsbuf1(w, (size_t)16 * 4u, 16);
    float* rows0 = rowsbuf0;
    float* rows1 = rowsbuf1;

    int prev_sy1 = -2;

    for (int dy = 0; dy < h; dy++)
    {
        int sy = yofs[dy];

        if (sy == prev_sy1)
        {
            // reuse all rows
        }
        else if (sy == prev_sy1 + 1)
        {
            // hresize one row
            float* rows0_old = rows0;
            rows0 = rows1;
            rows1 = rows0_old;
            const float* S1 = src.row(sy + 1);

            const float* alphap = alpha;
            float* rows1p = rows1;
            int dx = 0;
            for (; dx < w; dx++)
            {
                int sx = xofs[dx] * 16;
                const float* S1p = S1 + sx;

                __m512 _a0 = _mm512_set1_ps(alphap[0]);
                __m512 _a1 = _mm512_set1_ps(alphap[1]);

                __m512 _S10 = _mm512_load_ps(S1p);
                __m512 _S11 = _mm512_load_ps(S1p + 16);
                __m512 _rows1 = _mm512_mul_ps(_S10, _a0);
                _rows1 = _mm512_fmadd_ps(_S11, _a1, _rows1);
                _mm512_store_ps(rows1p + dx * 16, _rows1);

                alphap += 2;
            }
        }
        else
        {
            // hresize two rows
            const float* S0 = src.row(sy);
            const float* S1 = src.row(sy + 1);

            const float* alphap = alpha;
            float* rows0p = rows0;
            float* rows1p = rows1;
            int dx = 0;
            for (; dx < w; dx++)
            {
                int sx = xofs[dx] * 16;
                const float* S0p = S0 + sx;
                const float* S1p = S1 + sx;

                __m512 _a0 = _mm512_set1_ps(alphap[0]);
                __m512 _a1 = _mm512_set1_ps(alphap[1]);

                __m512 _S00 = _mm512_load_ps(S0p);
                __m512 _S01 = _mm512_load_ps(S0p + 16);
                __m512 _S10 = _mm512_load_ps(S1p);
                __m512 _S11 = _mm512_load_ps(S1p + 16);
                __m512 _rows0 = _mm512_mul_ps(_S00, _a0);
                __m512 _rows1 = _mm512_mul_ps(_S10, _a0);
                _rows0 = _mm512_fmadd_ps(_S01, _a1, _rows0);
                _rows1 = _mm512_fmadd_ps(_S11, _a1, _rows1);
                _mm512_store_ps(rows0p + dx * 16, _rows0);
                _mm512_store_ps(rows1p + dx * 16, _rows1);

                alphap += 2;
            }
        }

        prev_sy1 = sy;

        // vresize
        __m512 _b0 = _mm512_set1_ps(beta[0]);
        __m512 _b1 = _mm512_set1_ps(beta[1]);

        float* rows0p = rows0;
        float* rows1p = rows1;
        float* Dp = dst.row(dy);

        for (int dx = 0; dx < w; dx++)
        {
            __m512 _rows0 = _mm512_load_ps(rows0p);
            __m512 _rows1 = _mm512_load_ps(rows1p);
            __m512 _D = _mm512_mul_ps(_rows0, _b0);
            _D = _mm512_fmadd_ps(_rows1, _b1, _D);
            _mm512_store_ps(Dp, _D);

            Dp += 16;
            rows0p += 16;
            rows1p += 16;
        }

        beta += 2;
    }
}